

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

void si9ma::BinaryTree::iterative_pre_order(TreeNode *head)

{
  bool bVar1;
  reference ppTVar2;
  ostream *poVar3;
  undefined1 local_60 [8];
  stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
  s_stack;
  TreeNode *head_local;
  
  if (head != (TreeNode *)0x0) {
    s_stack.c.super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)head;
    std::
    stack<si9ma::TreeNode_const*,std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>>
    ::stack<std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>,void>
              ((stack<si9ma::TreeNode_const*,std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>>
                *)local_60);
    std::
    stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
    ::push((stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
            *)local_60,
           (value_type *)
           &s_stack.c.
            super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node);
    while (bVar1 = std::
                   stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                   ::empty((stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                            *)local_60), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppTVar2 = std::
                stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                ::top((stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                       *)local_60);
      s_stack.c.super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)*ppTVar2;
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          ((value_type)
                          s_stack.c.
                          super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node)->value);
      std::operator<<(poVar3," ");
      std::
      stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
      ::pop((stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
             *)local_60);
      if (s_stack.c.
          super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_node[2] != (TreeNode **)0x0) {
        std::
        stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
        ::push((stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                *)local_60,
               (value_type *)
               (s_stack.c.
                super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node + 2));
      }
      if (s_stack.c.
          super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_node[1] != (TreeNode **)0x0) {
        std::
        stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
        ::push((stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                *)local_60,
               (value_type *)
               (s_stack.c.
                super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node + 1));
      }
    }
    std::
    stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
    ::~stack((stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
              *)local_60);
  }
  return;
}

Assistant:

void BinaryTree::iterative_pre_order(const TreeNode *head) {
        if (head == nullptr)
            return;

        stack<const TreeNode *> s_stack;
        s_stack.push(head);
        while (!s_stack.empty()){
            head = s_stack.top();
            cout << head->value << " ";
            s_stack.pop();

            if (head->right != nullptr)
                s_stack.push(head->right);

            if (head->left != nullptr)
                s_stack.push(head->left);
        }
    }